

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O3

int sscal_(integer *n,real *sa,real *sx,integer *incx)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = *n;
  if (0 < (int)uVar1) {
    iVar2 = *incx;
    if (0 < (long)iVar2) {
      if (iVar2 == 1) {
        if (uVar1 % 5 == 0) {
          if ((int)uVar1 < 1) {
            return 0;
          }
        }
        else {
          uVar6 = 0;
          do {
            sx[uVar6] = *sa * sx[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar1 % 5 != uVar6);
          if ((int)uVar1 < 5) {
            return 0;
          }
        }
        uVar6 = (ulong)(uVar1 % 5 + 1);
        pfVar4 = sx + uVar6;
        do {
          pfVar4[-1] = *sa * pfVar4[-1];
          *pfVar4 = *sa * *pfVar4;
          pfVar4[1] = *sa * pfVar4[1];
          pfVar4[2] = *sa * pfVar4[2];
          pfVar4[3] = *sa * pfVar4[3];
          pfVar4 = pfVar4 + 5;
          uVar3 = (int)uVar6 + 5;
          uVar6 = (ulong)uVar3;
        } while ((int)uVar3 <= (int)uVar1);
      }
      else {
        iVar5 = 1;
        do {
          *sx = *sa * *sx;
          sx = sx + iVar2;
          iVar5 = iVar5 + iVar2;
        } while (iVar5 <= (int)(uVar1 * iVar2));
      }
    }
  }
  return 0;
}

Assistant:

int sscal_(integer *n, real *sa, real *sx, integer *incx)
{
    /* System generated locals */
    integer i__1, i__2;

    /* Local variables */
    static integer i__, m, mp1, nincx;


/*
       scales a vector by a constant.
       uses unrolled loops for increment equal to 1.
       jack dongarra, linpack, 3/11/78.
       modified 3/93 to return if incx .le. 0.
       modified 12/3/93, array(1) declarations changed to array(*)
*/


    /* Parameter adjustments */
    --sx;

    /* Function Body */
    if (*n <= 0 || *incx <= 0) {
	return 0;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    nincx = *n * *incx;
    i__1 = nincx;
    i__2 = *incx;
    for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	sx[i__] = *sa * sx[i__];
/* L10: */
    }
    return 0;

/*
          code for increment equal to 1


          clean-up loop
*/

L20:
    m = *n % 5;
    if (m == 0) {
	goto L40;
    }
    i__2 = m;
    for (i__ = 1; i__ <= i__2; ++i__) {
	sx[i__] = *sa * sx[i__];
/* L30: */
    }
    if (*n < 5) {
	return 0;
    }
L40:
    mp1 = m + 1;
    i__2 = *n;
    for (i__ = mp1; i__ <= i__2; i__ += 5) {
	sx[i__] = *sa * sx[i__];
	sx[i__ + 1] = *sa * sx[i__ + 1];
	sx[i__ + 2] = *sa * sx[i__ + 2];
	sx[i__ + 3] = *sa * sx[i__ + 3];
	sx[i__ + 4] = *sa * sx[i__ + 4];
/* L50: */
    }
    return 0;
}